

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::MaybeInitializeMemory
          (SparseArray<re2::NFA::Thread_*> *this,int min,int max)

{
  int max_local;
  int min_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  return;
}

Assistant:

void MaybeInitializeMemory(int min, int max) {
#if __has_feature(memory_sanitizer)
    __msan_unpoison(sparse_.data() + min, (max - min) * sizeof sparse_[0]);
#elif defined(RE2_ON_VALGRIND)
    for (int i = min; i < max; i++) {
      sparse_[i] = 0xababababU;
    }
#endif
  }